

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
::
emplaceRealloc<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
          (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
           *this,pointer pos,
          tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
          *args)

{
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar1;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *pSVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
  *p;
  undefined8 uVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (*(long *)(this + 8) == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar5 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar5 * 2) {
    uVar10 = uVar5 * 2;
  }
  if (0x555555555555555 - uVar5 < uVar5) {
    uVar10 = 0x555555555555555;
  }
  lVar9 = (long)pos - *(long *)this;
  pvVar7 = operator_new(uVar10 * 0x18);
  uVar6 = *(undefined8 *)
           ((long)&(args->
                   super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                   ).
                   super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                   .
                   super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                   ._M_head_impl.
                   super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                   .
                   super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           + 8);
  *(undefined8 *)((long)pvVar7 + lVar9) =
       *(undefined8 *)
        &(args->
         super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         ).
         super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         .
         super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
         ._M_head_impl.
         super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  ;
  ((undefined8 *)((long)pvVar7 + lVar9))[1] = uVar6;
  *(Symbol **)((long)pvVar7 + lVar9 + 0x10) =
       (args->
       super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
       ).super__Head_base<0UL,_const_slang::ast::Symbol_*,_false>._M_head_impl;
  p = *(SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
        **)this;
  pSVar1 = p + *(long *)(this + 8) * 0x18;
  if (pSVar1 == (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                 *)pos) {
    if (*(long *)(this + 8) != 0) {
      lVar8 = 0;
      do {
        pSVar2 = p + lVar8;
        uVar6 = *(undefined8 *)(pSVar2 + 8);
        *(undefined8 *)((long)pvVar7 + lVar8) = *(undefined8 *)pSVar2;
        ((undefined8 *)((long)pvVar7 + lVar8))[1] = uVar6;
        *(undefined8 *)((long)pvVar7 + lVar8 + 0x10) = *(undefined8 *)(pSVar2 + 0x10);
        lVar8 = lVar8 + 0x18;
      } while (pSVar2 + 0x18 != pSVar1);
    }
  }
  else {
    if (p != (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
              *)pos) {
      lVar8 = 0;
      do {
        pSVar2 = p + lVar8;
        uVar6 = *(undefined8 *)(pSVar2 + 8);
        *(undefined8 *)((long)pvVar7 + lVar8) = *(undefined8 *)pSVar2;
        ((undefined8 *)((long)pvVar7 + lVar8))[1] = uVar6;
        *(undefined8 *)((long)pvVar7 + lVar8 + 0x10) = *(undefined8 *)(pSVar2 + 0x10);
        lVar8 = lVar8 + 0x18;
      } while (pSVar2 + 0x18 !=
               (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                *)pos);
    }
    lVar8 = 0;
    do {
      puVar3 = (undefined8 *)
               ((long)&(pos->
                       super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                       ).
                       super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                       .
                       super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                       ._M_head_impl.
                       super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                       .
                       super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                       .
                       super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
               + lVar8);
      uVar6 = puVar3[1];
      puVar4 = (undefined8 *)((long)pvVar7 + lVar8 + lVar9 + 0x18);
      *puVar4 = *puVar3;
      puVar4[1] = uVar6;
      *(undefined8 *)((long)pvVar7 + lVar8 + lVar9 + 0x28) = puVar3[2];
      lVar8 = lVar8 + 0x18;
    } while ((SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
              *)(puVar3 + 3) != pSVar1);
  }
  if (p != this + 0x18) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(void **)this = pvVar7;
  return (pointer)((long)pvVar7 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}